

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O3

void icu_63::checkAlias(char *itemName,Resource res,UChar *alias,int32_t length,UBool useResSuffix,
                       CheckDependency *check,void *context,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UResType UVar2;
  char *suffix;
  uint uVar3;
  ulong uVar4;
  char target [200];
  UErrorCode *in_stack_fffffffffffffed8;
  char local_118 [32];
  char local_f8 [200];
  
  UVar1 = uprv_isInvariantUString_63(alias,length);
  if (UVar1 == '\0') {
    fprintf(_stderr,
            "icupkg/ures_enumDependencies(%s res=%08x) alias string contains non-invariant characters\n"
            ,itemName,res);
    *pErrorCode = U_INVALID_CHAR_FOUND;
    return;
  }
  if (length < 1) {
    UVar2 = res_getPublicType_63(res);
    uVar3 = 0;
    if (UVar2 == RES_ALIAS) {
      return;
    }
  }
  else {
    uVar4 = 0;
    do {
      if (alias[uVar4] == L'/') goto LAB_001e97c0;
      uVar4 = uVar4 + 1;
    } while ((uint)length != uVar4);
    uVar4 = (ulong)(uint)length;
LAB_001e97c0:
    uVar3 = (uint)uVar4;
    UVar2 = res_getPublicType_63(res);
    if (UVar2 == RES_ALIAS) {
      length = uVar3;
      if (uVar3 == 0) {
        return;
      }
      goto LAB_001e97f5;
    }
  }
  if (uVar3 != length) {
    fprintf(_stderr,"icupkg/ures_enumDependencies(%s res=%08x) %%ALIAS contains a \'/\'\n",itemName,
            res);
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return;
  }
LAB_001e97f5:
  if (length < 0x20) {
    u_UCharsToChars_63(alias,local_118,length);
    local_118[length] = '\0';
    suffix = ".res";
    if (useResSuffix == '\0') {
      suffix = "";
    }
    makeTargetName(itemName,local_118,-1,suffix,local_f8,(int32_t)pErrorCode,
                   in_stack_fffffffffffffed8);
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      (*check)(context,itemName,local_f8);
    }
  }
  else {
    fprintf(_stderr,
            "icupkg/ures_enumDependencies(%s res=%08x) alias locale ID length %ld too long\n",
            itemName,res,(ulong)(uint)length);
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

static void
checkAlias(const char *itemName,
           Resource res, const UChar *alias, int32_t length, UBool useResSuffix,
           CheckDependency check, void *context, UErrorCode *pErrorCode) {
    int32_t i;

    if(!uprv_isInvariantUString(alias, length)) {
        fprintf(stderr, "icupkg/ures_enumDependencies(%s res=%08x) alias string contains non-invariant characters\n",
                        itemName, res);
        *pErrorCode=U_INVALID_CHAR_FOUND;
        return;
    }

    // extract the locale ID from alias strings like
    // locale_ID/key1/key2/key3
    // locale_ID

    // search for the first slash
    for(i=0; i<length && alias[i]!=SLASH; ++i) {}

    if(res_getPublicType(res)==URES_ALIAS) {
        // ignore aliases with an initial slash:
        // /ICUDATA/... and /pkgname/... go to a different package
        // /LOCALE/... are for dynamic sideways fallbacks and don't go to a fixed bundle
        if(i==0) {
            return; // initial slash ('/')
        }

        // ignore the intra-bundle path starting from the first slash ('/')
        length=i;
    } else /* URES_STRING */ {
        // the whole string should only consist of a locale ID
        if(i!=length) {
            fprintf(stderr, "icupkg/ures_enumDependencies(%s res=%08x) %%ALIAS contains a '/'\n",
                            itemName, res);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return;
        }
    }

    // convert the Unicode string to char *
    char localeID[32];
    if(length>=(int32_t)sizeof(localeID)) {
        fprintf(stderr, "icupkg/ures_enumDependencies(%s res=%08x) alias locale ID length %ld too long\n",
                        itemName, res, (long)length);
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return;
    }
    u_UCharsToChars(alias, localeID, length);
    localeID[length]=0;

    checkIDSuffix(itemName, localeID, -1, (useResSuffix ? ".res" : ""), check, context, pErrorCode);
}